

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O0

void ssh2channel_start_command(SshChannel *sc,_Bool want_reply,char *command)

{
  ssh2_connection_state *psVar1;
  PktOut *pPVar2;
  code *handler;
  PktOut *pktout;
  ssh2_connection_state *s;
  ssh2_channel *c;
  char *command_local;
  _Bool want_reply_local;
  SshChannel *sc_local;
  
  psVar1 = ((ssh2_channel *)(sc + -0xb))->connlayer;
  handler = (cr_handler_fn_t)0x0;
  if (want_reply) {
    handler = ssh2_channel_response;
  }
  pPVar2 = ssh2_chanreq_init((ssh2_channel *)(sc + -0xb),"exec",handler,(void *)0x0);
  BinarySink_put_stringz(pPVar2->binarysink_,command);
  pq_base_push(&((psVar1->ppl).out_pq)->pqb,&pPVar2->qnode);
  return;
}

Assistant:

void ssh2channel_start_command(
    SshChannel *sc, bool want_reply, const char *command)
{
    struct ssh2_channel *c = container_of(sc, struct ssh2_channel, sc);
    struct ssh2_connection_state *s = c->connlayer;

    PktOut *pktout = ssh2_chanreq_init(
        c, "exec", want_reply ? ssh2_channel_response : NULL, NULL);
    put_stringz(pktout, command);
    pq_push(s->ppl.out_pq, pktout);
}